

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O3

c_v128 __thiscall simd_test_sse2::c_imm_v128_shl_n_8<1>(simd_test_sse2 *this,c_v128 a)

{
  c_v128 cVar1;
  
  cVar1.u8[9] = a.u8[1] * '\x02';
  cVar1.u8[8] = a.u8[0] * '\x02';
  cVar1.u8[10] = a.u8[2] * '\x02';
  cVar1.u8[0xb] = a.u8[3] * '\x02';
  cVar1.u8[0xc] = a.u8[4] * '\x02';
  cVar1.u8[0xd] = a.u8[5] * '\x02';
  cVar1.u8[0xe] = a.u8[6] * '\x02';
  cVar1.u8[0xf] = a.u8[7] * '\x02';
  cVar1.u8[1] = (char)((ulong)this >> 8) * '\x02';
  cVar1.u8[0] = (char)this * '\x02';
  cVar1.u8[2] = (char)((ulong)this >> 0x10) * '\x02';
  cVar1.u8[3] = (char)((ulong)this >> 0x18) * '\x02';
  cVar1.u8[4] = (char)((ulong)this >> 0x20) * '\x02';
  cVar1.u8[5] = (char)((ulong)this >> 0x28) * '\x02';
  cVar1.u8[6] = (char)((ulong)this >> 0x30) * '\x02';
  cVar1.u8[7] = (char)((ulong)this >> 0x38) * '\x02';
  return cVar1;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shl_8(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 7) {
    fprintf(stderr, "Error: Undefined u8 shift left %d\n", n);
    abort();
  }
  for (c = 0; c < 8; c++) t.s8[c] = (int8_t)(a.u8[c] << n);
  return t;
}